

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void __thiscall tree::Tree::changeRoot(Tree *this,string *root)

{
  rep_conflict rVar1;
  int e;
  bool bVar2;
  FileItem *pFVar3;
  reference ppFVar4;
  reference ppFVar5;
  size_type sVar6;
  list<int,_std::allocator<int>_> *this_00;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_180;
  duration<long,_std::ratio<1L,_1000000000L>_> local_178;
  duration<double,_std::ratio<1L,_1L>_> local_170;
  duration<double,_std::ratio<1L,_1L>_> time_change_root;
  int local_148;
  size_type new_size;
  FileItem *item;
  iterator __end1;
  iterator __begin1;
  vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *__range1;
  vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> child_fileitem;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret;
  path local_c8;
  FileItem *local_a8;
  FileItem *fileitem;
  size_type old_size;
  _Self local_78;
  column local_6c;
  _List_node_base *local_68;
  _List_iterator<int> local_60;
  _Self local_58;
  _List_iterator<int> i;
  undefined1 local_40 [8];
  path dir;
  time_point start_change_root;
  string *root_local;
  Tree *this_local;
  
  dir.m_pathname.field_2._8_8_ = std::chrono::_V2::system_clock::now();
  boost::filesystem::path::path((path *)local_40,root);
  bVar2 = boost::filesystem::exists((path *)local_40);
  if (bVar2) {
    this_00 = &(this->cfg).columns;
    local_60._M_node =
         (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::begin(this_00);
    local_68 = (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::end(this_00);
    local_6c = GIT;
    local_58._M_node =
         (_List_node_base *)
         std::find<std::_List_iterator<int>,tree::column>
                   (local_60,(_List_iterator<int>)local_68,&local_6c);
    local_78._M_node =
         (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::end(&(this->cfg).columns)
    ;
    bVar2 = std::operator!=(&local_58,&local_78);
    if (bVar2) {
      std::__cxx11::string::string((string *)&old_size,(string *)root);
      FileItem::update_gmap((string *)&old_size);
      std::__cxx11::string::~string((string *)&old_size);
    }
    std::__cxx11::list<int,_std::allocator<int>_>::clear(&this->m_targets);
    fileitem = (FileItem *)
               std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::size
                         (&this->m_fileitem);
    erase_entrylist(this,0,(int)fileitem);
    pFVar3 = (FileItem *)operator_new(0x58);
    boost::filesystem::path::path(&local_c8,(path *)local_40);
    FileItem::FileItem(pFVar3,&local_c8);
    boost::filesystem::path::~path(&local_c8);
    pFVar3->level = -1;
    pFVar3->opened_tree = true;
    local_a8 = pFVar3;
    std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::push_back
              (&this->m_fileitem,&local_a8);
    insert_rootcell(this,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&line.field_2 + 8));
    makeline_abi_cxx11_((string *)
                        &child_fileitem.
                         super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,this,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&line.field_2 + 8),
                (value_type *)
                &child_fileitem.
                 super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::vector
              ((vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *)&__range1);
    ppFVar4 = std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::operator[]
                        (&this->m_fileitem,0);
    entryInfoListRecursively
              (this,*ppFVar4,
               (vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *)&__range1);
    __end1 = std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::begin
                       ((vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *)&__range1);
    item = (FileItem *)
           std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::end
                     ((vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *)&__range1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<tree::FileItem_**,_std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>_>
                                       *)&item), bVar2) {
      ppFVar5 = __gnu_cxx::
                __normal_iterator<tree::FileItem_**,_std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>_>
                ::operator*(&__end1);
      new_size = (size_type)*ppFVar5;
      std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::push_back
                (&this->m_fileitem,(value_type *)&new_size);
      __gnu_cxx::
      __normal_iterator<tree::FileItem_**,_std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>_>
      ::operator++(&__end1);
    }
    insert_entrylist(this,(vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *)&__range1,1
                     ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&line.field_2 + 8));
    pFVar3 = (FileItem *)
             std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::size
                       (&this->m_fileitem);
    if (pFVar3 < fileitem) {
      local_148 = (int)pFVar3;
      e = (int)fileitem;
      time_change_root.__r = 0.0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&time_change_root);
      buf_set_lines(this,local_148,e,true,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&time_change_root);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&time_change_root);
    }
    buf_set_lines(this,0,-1,true,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&line.field_2 + 8));
    sVar6 = std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::size
                      (&this->m_fileitem);
    hline(this,0,(int)sVar6);
    local_180.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_178.__r =
         (rep)std::chrono::operator-
                        (&local_180,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)((long)&dir.m_pathname.field_2 + 8));
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_170,&local_178);
    rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_170);
    printf("change_root Elapsed time:%.9f secs.\n",SUB84(rVar1,0));
    std::vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>::~vector
              ((vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *)&__range1);
    std::__cxx11::string::~string
              ((string *)
               &child_fileitem.
                super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&line.field_2 + 8));
    i._M_node._0_4_ = 0;
  }
  else {
    i._M_node._0_4_ = 1;
  }
  boost::filesystem::path::~path((path *)local_40);
  return;
}

Assistant:

void Tree::changeRoot(const string &root)
{
#ifndef NDEBUG
    auto start_change_root = system_clock::now();
#endif
    // TODO: cursor history
    path dir(root);
    if (!exists(dir)) {
        return;
    }

    // TODO broken when hold on redraw 10s
    auto i = find(cfg.columns.begin(), cfg.columns.end(), GIT);
    if (i != cfg.columns.end()) {
        FileItem::update_gmap(root);
    }
    m_targets.clear();
    const auto old_size = m_fileitem.size();
    erase_entrylist(0, old_size);

    FileItem *fileitem = new FileItem(dir);
    fileitem->level = -1;
    fileitem->opened_tree = true;
    m_fileitem.push_back(fileitem);

    insert_rootcell(0);
    // FIXME: when icon not available
    // col_map[ICON][0].text = "";

    vector<string> ret;
    string line = makeline(0);
    ret.push_back(line);

    vector<FileItem *> child_fileitem;
    entryInfoListRecursively(*m_fileitem[0], child_fileitem);
    for (auto item : child_fileitem) {
        m_fileitem.push_back(item);
    }

    insert_entrylist(child_fileitem, 1, ret);

    // NOTE: The cursor will jump when replacing text with unequal lines
    const auto new_size = m_fileitem.size();
    if (new_size < old_size) {
        buf_set_lines(new_size, old_size, true, {});
    }
    buf_set_lines(0, -1, true, ret);

    hline(0, m_fileitem.size());
#ifndef NDEBUG
    duration<double> time_change_root = system_clock::now() - start_change_root;
    printf("change_root Elapsed time:%.9f secs.\n", time_change_root.count());
#endif
}